

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O3

rbtree_node_base * eastl::RBTreeRotateRight(rbtree_node_base *pNode,rbtree_node_base *pNodeRoot)

{
  rbtree_node_base *prVar1;
  this_type *ptVar2;
  rbtree_node_base *prVar3;
  
  prVar1 = pNode->mpNodeLeft;
  ptVar2 = prVar1->mpNodeRight;
  pNode->mpNodeLeft = ptVar2;
  if (ptVar2 != (this_type *)0x0) {
    ptVar2->mpNodeParent = pNode;
  }
  ptVar2 = pNode->mpNodeParent;
  prVar1->mpNodeParent = ptVar2;
  prVar3 = prVar1;
  if (pNode != pNodeRoot) {
    (&ptVar2->mpNodeRight)[ptVar2->mpNodeRight != pNode] = prVar1;
    prVar3 = pNodeRoot;
  }
  prVar1->mpNodeRight = pNode;
  pNode->mpNodeParent = prVar1;
  return prVar3;
}

Assistant:

rbtree_node_base* RBTreeRotateRight(rbtree_node_base* pNode, rbtree_node_base* pNodeRoot)
    {
        rbtree_node_base* const pNodeTemp = pNode->mpNodeLeft;

        pNode->mpNodeLeft = pNodeTemp->mpNodeRight;

        if(pNodeTemp->mpNodeRight)
            pNodeTemp->mpNodeRight->mpNodeParent = pNode;
        pNodeTemp->mpNodeParent = pNode->mpNodeParent;

        if(pNode == pNodeRoot)
            pNodeRoot = pNodeTemp;
        else if(pNode == pNode->mpNodeParent->mpNodeRight)
            pNode->mpNodeParent->mpNodeRight = pNodeTemp;
        else
            pNode->mpNodeParent->mpNodeLeft = pNodeTemp;

        pNodeTemp->mpNodeRight = pNode;
        pNode->mpNodeParent = pNodeTemp;

        return pNodeRoot;
    }